

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O3

JsonObjectWriter * __thiscall
google::protobuf::util::converter::JsonObjectWriter::RenderInt32
          (JsonObjectWriter *this,StringPiece name,int32 value)

{
  StringPiece s;
  char *pcVar1;
  char local_70 [32];
  char *local_50;
  size_t local_48;
  char local_40 [16];
  
  pcVar1 = FastInt32ToBufferLeft(value,local_70);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_70,pcVar1);
  s.length_ = local_48;
  s.ptr_ = local_50;
  if ((long)local_48 < 0) {
    StringPiece::LogFatalSizeTooBig(local_48,"size_t to int conversion");
  }
  WritePrefix(this,name);
  WriteRawString(this,s);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return this;
}

Assistant:

JsonObjectWriter* JsonObjectWriter::RenderInt32(StringPiece name,
                                                int32 value) {
  return RenderSimple(name, StrCat(value));
}